

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssembly.cpp
# Opt level: O0

Var Js::WebAssembly::EntryInstantiate(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e_00;
  ScriptContext *pSVar3;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar4;
  JavascriptLibrary *this_00;
  Var pvVar5;
  WebAssemblyModule *pWVar6;
  WebAssemblyInstance *newValue;
  JavascriptException *e;
  WebAssemblyInstance *instance;
  WebAssemblyModule *wasmModule;
  WebAssemblySource src;
  Var importObject;
  WebAssemblyInstance *local_58;
  Var resultObject;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar3 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar3);
  pSVar3 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar3,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssembly.cpp"
                                ,0x4b,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  if (((ulong)scriptContext & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssembly.cpp"
                                ,0x4c,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pSVar3 = RecyclableObject::GetScriptContext(function);
  e_00 = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                       (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                        CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                       CallFlags_New),CallFlags_New);
  bVar2 = operator!(e_00);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssembly.cpp"
                                ,0x4f,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (((uint)scriptContext & 0xffffff) < 2) {
    JavascriptError::ThrowTypeError(pSVar3,-0x7ff5e496,(PCWSTR)0x0);
  }
  this_00 = ScriptContext::GetLibrary(pSVar3);
  src.sourceInfo =
       (Utf8SourceInfo *)JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
  if (2 < ((uint)scriptContext & 0xffffff)) {
    src.sourceInfo = (Utf8SourceInfo *)Arguments::operator[]((Arguments *)&scriptContext,2);
  }
  pvVar5 = Arguments::operator[]((Arguments *)&scriptContext,1);
  bVar2 = VarIs<Js::WebAssemblyModule>(pvVar5);
  if (bVar2) {
    pvVar5 = Arguments::operator[]((Arguments *)&scriptContext,1);
    pWVar6 = VarTo<Js::WebAssemblyModule>(pvVar5);
    local_58 = WebAssemblyInstance::CreateInstance(pWVar6,src.sourceInfo);
  }
  else {
    pvVar5 = Arguments::operator[]((Arguments *)&scriptContext,1);
    WebAssemblySource::WebAssemblySource((WebAssemblySource *)&wasmModule,pvVar5,true,pSVar3);
    pWVar6 = WebAssemblyModule::CreateModule(pSVar3,(WebAssemblySource *)&wasmModule);
    newValue = WebAssemblyInstance::CreateInstance(pWVar6,src.sourceInfo);
    local_58 = (WebAssemblyInstance *)Js::JavascriptOperators::NewJavascriptObjectNoArg(pSVar3);
    Js::JavascriptOperators::OP_SetProperty
              (local_58,0xe5,pWVar6,pSVar3,(PropertyValueInfo *)0x0,PropertyOperation_None,(Var)0x0)
    ;
    Js::JavascriptOperators::OP_SetProperty
              (local_58,0xe6,newValue,pSVar3,(PropertyValueInfo *)0x0,PropertyOperation_None,
               (Var)0x0);
  }
  pvVar5 = JavascriptPromise::CreateResolvedPromise(local_58,pSVar3,(Var)0x0);
  return pvVar5;
}

Assistant:

Var WebAssembly::EntryInstantiate(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));

    Var resultObject = nullptr;
    try
    {
        if (args.Info.Count < 2)
        {
            JavascriptError::ThrowTypeError(scriptContext, WASMERR_InvalidInstantiateArgument);
        }

        Var importObject = scriptContext->GetLibrary()->GetUndefined();
        if (args.Info.Count >= 3)
        {
            importObject = args[2];
        }

        if (VarIs<WebAssemblyModule>(args[1]))
        {
            resultObject = WebAssemblyInstance::CreateInstance(VarTo<WebAssemblyModule>(args[1]), importObject);
        }
        else
        {
            WebAssemblySource src(args[1], true, scriptContext);
            WebAssemblyModule* wasmModule = WebAssemblyModule::CreateModule(scriptContext, &src);

            WebAssemblyInstance* instance = WebAssemblyInstance::CreateInstance(wasmModule, importObject);

            resultObject = JavascriptOperators::NewJavascriptObjectNoArg(scriptContext);

            JavascriptOperators::OP_SetProperty(resultObject, PropertyIds::module, wasmModule, scriptContext);
            JavascriptOperators::OP_SetProperty(resultObject, PropertyIds::instance, instance, scriptContext);
        }
        return JavascriptPromise::CreateResolvedPromise(resultObject, scriptContext);
    }
    catch (JavascriptException & e)
    {
        return JavascriptPromise::CreateRejectedPromise(e.GetAndClear()->GetThrownObject(scriptContext), scriptContext);
    }
}